

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

void duckdb::CountFunction::CountUpdateLoop
               (STATE *result,ValidityMask *mask,idx_t count,SelectionVector *sel_vector)

{
  bool bVar1;
  idx_t row_idx;
  idx_t i;
  idx_t iVar2;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    *result = *result + count;
  }
  else {
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      row_idx = iVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)sel_vector->sel_vector[iVar2];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar1) {
        *result = *result + 1;
      }
    }
  }
  return;
}

Assistant:

static inline void CountUpdateLoop(STATE &result, ValidityMask &mask, idx_t count,
	                                   const SelectionVector &sel_vector) {
		if (mask.AllValid()) {
			// no NULL values
			result += UnsafeNumericCast<STATE>(count);
			return;
		}
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector.get_index(i);
			if (mask.RowIsValid(idx)) {
				result++;
			}
		}
	}